

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O1

bool __thiscall ccs::CcsContext::get<bool>(CcsContext *this,string *propertyName,bool *defaultVal)

{
  bool bVar1;
  bool t;
  string str;
  bool local_39;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  bVar1 = getInto(this,&local_38,propertyName);
  if (bVar1) {
    bVar1 = coerceString<bool>(&local_38,&local_39);
    if (bVar1) {
      defaultVal = &local_39;
    }
  }
  bVar1 = *defaultVal;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

T CcsContext::get(const std::string &propertyName, const T &defaultVal) const {
  std::string str;
  if (!getInto(str, propertyName)) return defaultVal;
  T t;
  if (!coerceString(str, t)) return defaultVal;
  return t;
}